

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QSize __thiscall QDockWidgetTitleButton::sizeHint(QDockWidgetTitleButton *this)

{
  undefined1 uVar1;
  int iVar2;
  QStyle *pQVar3;
  QDockWidgetTitleButton *in_RDI;
  long in_FS_OFFSET;
  int size;
  QSize sz;
  QWidget *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar4;
  int local_38;
  int local_34;
  QSize local_30;
  QIcon in_stack_ffffffffffffffd8;
  QIcon local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished((QWidget *)in_stack_ffffffffffffffd8.d);
  pQVar3 = QWidget::style(in_stack_ffffffffffffffa8);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x49,0,in_RDI);
  iVar2 = iVar2 << 1;
  QAbstractButton::icon((QAbstractButton *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
  uVar1 = QIcon::isNull();
  uVar4 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffb8) ^ 0xff000000;
  QIcon::~QIcon(&local_18);
  if ((uVar4 & 0x1000000) != 0) {
    QAbstractButton::icon((QAbstractButton *)CONCAT44(iVar2,uVar4));
    local_30 = dockButtonIconSize(in_RDI);
    QIcon::actualSize((QSize *)&stack0xffffffffffffffd8,(Mode)&local_30,On);
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffd8);
    local_34 = QSize::width((QSize *)0x589fd1);
    local_38 = QSize::height((QSize *)0x589fdf);
    qMax<int>(&local_34,&local_38);
  }
  QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (int)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QDockWidgetTitleButton::sizeHint() const
{
    ensurePolished();

    int size = 2*style()->pixelMetric(QStyle::PM_DockWidgetTitleBarButtonMargin, nullptr, this);
    if (!icon().isNull()) {
        const QSize sz = icon().actualSize(dockButtonIconSize());
        size += qMax(sz.width(), sz.height());
    }

    return QSize(size, size);
}